

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O0

int Bal_CutMergeOrder(Bal_Cut_t *pCut0,Bal_Cut_t *pCut1,Bal_Cut_t *pCut,int nLutSize)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *pC;
  int c;
  int *pC1;
  int k;
  int *pC0;
  int i;
  int nSize1;
  int nSize0;
  int nLutSize_local;
  Bal_Cut_t *pCut_local;
  Bal_Cut_t *pCut1_local;
  Bal_Cut_t *pCut0_local;
  
  uVar1 = *(uint *)&pCut0->field_0xc >> 0x1b;
  uVar2 = *(uint *)&pCut1->field_0xc >> 0x1b;
  if ((uVar1 == nLutSize) && (uVar2 == nLutSize)) {
    for (pC0._0_4_ = 0; (int)pC0 < (int)uVar1; pC0._0_4_ = (int)pC0 + 1) {
      if (pCut0->pLeaves[(int)pC0] != pCut1->pLeaves[(int)pC0]) {
        return 0;
      }
      pCut->pLeaves[(int)pC0] = pCut0->pLeaves[(int)pC0];
    }
    *(uint *)&pCut->field_0xc = *(uint *)&pCut->field_0xc & 0x7ffffff | nLutSize << 0x1b;
    *(uint *)&pCut->field_0xc = *(uint *)&pCut->field_0xc & 0xf8000000 | 0x7ffffff;
    pCut->Sign = pCut0->Sign | pCut1->Sign;
    iVar3 = Abc_MaxInt(pCut0->Delay,pCut1->Delay);
    pCut->Delay = iVar3;
    pCut0_local._4_4_ = 1;
  }
  else {
    pC1._4_4_ = 0;
    pC0._0_4_ = 0;
    for (pC._4_4_ = 0; pC._4_4_ != nLutSize; pC._4_4_ = pC._4_4_ + 1) {
      if (pCut0->pLeaves[(int)pC0] < pCut1->pLeaves[pC1._4_4_]) {
        iVar4 = (int)pC0 + 1;
        pCut->pLeaves[pC._4_4_] = pCut0->pLeaves[(int)pC0];
        iVar3 = pC1._4_4_;
        pC0._0_4_ = iVar4;
        if ((int)uVar1 <= iVar4) {
LAB_0090aa1d:
          pC1._4_4_ = iVar3;
          pC._4_4_ = pC._4_4_ + 1;
          if (nLutSize + pC1._4_4_ < (int)(pC._4_4_ + uVar2)) {
            return 0;
          }
          while (pC1._4_4_ < (int)uVar2) {
            pCut->pLeaves[pC._4_4_] = pCut1->pLeaves[pC1._4_4_];
            pC._4_4_ = pC._4_4_ + 1;
            pC1._4_4_ = pC1._4_4_ + 1;
          }
          *(uint *)&pCut->field_0xc = *(uint *)&pCut->field_0xc & 0x7ffffff | pC._4_4_ << 0x1b;
          *(uint *)&pCut->field_0xc = *(uint *)&pCut->field_0xc & 0xf8000000 | 0x7ffffff;
          pCut->Sign = pCut0->Sign | pCut1->Sign;
          iVar3 = Abc_MaxInt(pCut0->Delay,pCut1->Delay);
          pCut->Delay = iVar3;
          return 1;
        }
      }
      else {
        if (pCut1->pLeaves[pC1._4_4_] < pCut0->pLeaves[(int)pC0]) {
          pCut->pLeaves[pC._4_4_] = pCut1->pLeaves[pC1._4_4_];
        }
        else {
          iVar4 = (int)pC0 + 1;
          pCut->pLeaves[pC._4_4_] = pCut0->pLeaves[(int)pC0];
          iVar3 = pC1._4_4_ + 1;
          pC0._0_4_ = iVar4;
          if ((int)uVar1 <= iVar4) goto LAB_0090aa1d;
        }
        if ((int)uVar2 <= pC1._4_4_ + 1) {
          pC._4_4_ = pC._4_4_ + 1;
          if (nLutSize + (int)pC0 < (int)(pC._4_4_ + uVar1)) {
            return 0;
          }
          while ((int)pC0 < (int)uVar1) {
            pCut->pLeaves[pC._4_4_] = pCut0->pLeaves[(int)pC0];
            pC._4_4_ = pC._4_4_ + 1;
            pC0._0_4_ = (int)pC0 + 1;
          }
          *(uint *)&pCut->field_0xc = *(uint *)&pCut->field_0xc & 0x7ffffff | pC._4_4_ << 0x1b;
          *(uint *)&pCut->field_0xc = *(uint *)&pCut->field_0xc & 0xf8000000 | 0x7ffffff;
          pCut->Sign = pCut0->Sign | pCut1->Sign;
          iVar3 = Abc_MaxInt(pCut0->Delay,pCut1->Delay);
          pCut->Delay = iVar3;
          return 1;
        }
        pC1._4_4_ = pC1._4_4_ + 1;
      }
    }
    pCut0_local._4_4_ = 0;
  }
  return pCut0_local._4_4_;
}

Assistant:

static inline int Bal_CutMergeOrder( Bal_Cut_t * pCut0, Bal_Cut_t * pCut1, Bal_Cut_t * pCut, int nLutSize )
{ 
    int nSize0   = pCut0->nLeaves;
    int nSize1   = pCut1->nLeaves;
    int i, * pC0 = pCut0->pLeaves;
    int k, * pC1 = pCut1->pLeaves;
    int c, * pC  = pCut->pLeaves;
    // the case of the largest cut sizes
    if ( nSize0 == nLutSize && nSize1 == nLutSize )
    {
        for ( i = 0; i < nSize0; i++ )
        {
            if ( pC0[i] != pC1[i] )  return 0;
            pC[i] = pC0[i];
        }
        pCut->nLeaves = nLutSize;
        pCut->iFunc = BAL_NO_FUNC;
        pCut->Sign = pCut0->Sign | pCut1->Sign;
        pCut->Delay = Abc_MaxInt( pCut0->Delay, pCut1->Delay );
        return 1;
    }
    // compare two cuts with different numbers
    i = k = c = 0;
    while ( 1 )
    {
        if ( c == nLutSize ) return 0;
        if ( pC0[i] < pC1[k] )
        {
            pC[c++] = pC0[i++];
            if ( i >= nSize0 ) goto FlushCut1;
        }
        else if ( pC0[i] > pC1[k] )
        {
            pC[c++] = pC1[k++];
            if ( k >= nSize1 ) goto FlushCut0;
        }
        else
        {
            pC[c++] = pC0[i++]; k++;
            if ( i >= nSize0 ) goto FlushCut1;
            if ( k >= nSize1 ) goto FlushCut0;
        }
    }

FlushCut0:
    if ( c + nSize0 > nLutSize + i ) return 0;
    while ( i < nSize0 )
        pC[c++] = pC0[i++];
    pCut->nLeaves = c;
    pCut->iFunc = BAL_NO_FUNC;
    pCut->Sign = pCut0->Sign | pCut1->Sign;
    pCut->Delay = Abc_MaxInt( pCut0->Delay, pCut1->Delay );
    return 1;

FlushCut1:
    if ( c + nSize1 > nLutSize + k ) return 0;
    while ( k < nSize1 )
        pC[c++] = pC1[k++];
    pCut->nLeaves = c;
    pCut->iFunc = BAL_NO_FUNC;
    pCut->Sign = pCut0->Sign | pCut1->Sign;
    pCut->Delay = Abc_MaxInt( pCut0->Delay, pCut1->Delay );
    return 1;
}